

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VLinearCombination_Serial(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  realtype *xd;
  realtype *zd;
  sunindextype N;
  sunindextype j;
  int i;
  N_Vector z_local;
  N_Vector *X_local;
  realtype *c_local;
  int nvec_local;
  
  if (nvec < 1) {
    c_local._4_4_ = -1;
  }
  else if (nvec == 1) {
    N_VScale_Serial(*c,*X,z);
    c_local._4_4_ = 0;
  }
  else if (nvec == 2) {
    N_VLinearSum_Serial(*c,*X,c[1],X[1],z);
    c_local._4_4_ = 0;
  }
  else {
    lVar1 = *z->content;
    lVar2 = *(long *)((long)z->content + 0x10);
    if (((*X != z) || (*c != 1.0)) || (NAN(*c))) {
      if (*X == z) {
        for (N = 0; N < lVar1; N = N + 1) {
          *(double *)(lVar2 + N * 8) = *c * *(double *)(lVar2 + N * 8);
        }
        for (j._4_4_ = 1; j._4_4_ < nvec; j._4_4_ = j._4_4_ + 1) {
          lVar3 = *(long *)((long)X[j._4_4_]->content + 0x10);
          for (N = 0; N < lVar1; N = N + 1) {
            *(double *)(lVar2 + N * 8) =
                 c[j._4_4_] * *(double *)(lVar3 + N * 8) + *(double *)(lVar2 + N * 8);
          }
        }
        c_local._4_4_ = 0;
      }
      else {
        lVar3 = *(long *)((long)(*X)->content + 0x10);
        for (N = 0; N < lVar1; N = N + 1) {
          *(double *)(lVar2 + N * 8) = *c * *(double *)(lVar3 + N * 8);
        }
        for (j._4_4_ = 1; j._4_4_ < nvec; j._4_4_ = j._4_4_ + 1) {
          lVar3 = *(long *)((long)X[j._4_4_]->content + 0x10);
          for (N = 0; N < lVar1; N = N + 1) {
            *(double *)(lVar2 + N * 8) =
                 c[j._4_4_] * *(double *)(lVar3 + N * 8) + *(double *)(lVar2 + N * 8);
          }
        }
        c_local._4_4_ = 0;
      }
    }
    else {
      for (j._4_4_ = 1; j._4_4_ < nvec; j._4_4_ = j._4_4_ + 1) {
        lVar3 = *(long *)((long)X[j._4_4_]->content + 0x10);
        for (N = 0; N < lVar1; N = N + 1) {
          *(double *)(lVar2 + N * 8) =
               c[j._4_4_] * *(double *)(lVar3 + N * 8) + *(double *)(lVar2 + N * 8);
        }
      }
      c_local._4_4_ = 0;
    }
  }
  return c_local._4_4_;
}

Assistant:

int N_VLinearCombination_Serial(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;
  realtype*    xd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VScale */
  if (nvec == 1) {
    N_VScale_Serial(c[0], X[0], z);
    return(0);
  }

  /* should have called N_VLinearSum */
  if (nvec == 2) {
    N_VLinearSum_Serial(c[0], X[0], c[1], X[1], z);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  /*
   * X[0] += c[i]*X[i], i = 1,...,nvec-1
   */
  if ((X[0] == z) && (c[0] == ONE)) {
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * X[0] = c[0] * X[0] + sum{ c[i] * X[i] }, i = 1,...,nvec-1
   */
  if (X[0] == z) {
    for (j=0; j<N; j++) {
      zd[j] *= c[0];
    }
    for (i=1; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        zd[j] += c[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * z = sum{ c[i] * X[i] }, i = 0,...,nvec-1
   */
  xd = NV_DATA_S(X[0]);
  for (j=0; j<N; j++) {
    zd[j] = c[0] * xd[j];
  }
  for (i=1; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    for (j=0; j<N; j++) {
      zd[j] += c[i] * xd[j];
    }
  }
  return(0);
}